

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O1

bool absl::lts_20250127::anon_unknown_0::MustRoundUp
               (uint64_t guess_mantissa,int guess_exponent,ParsedFloat *parsed_decimal)

{
  uint64_t v;
  int n;
  bool bVar1;
  BigUnsigned<84> *pBVar2;
  int iVar3;
  BigUnsigned<84> rhs;
  BigUnsigned<84> exact_mantissa;
  BigUnsigned<84> local_2d8;
  BigUnsigned<84> local_184;
  
  memset(&local_184,0,0x154);
  n = strings_internal::BigUnsigned<84>::ReadFloatMantissa(&local_184,parsed_decimal,0x300);
  v = guess_mantissa * 2 + 1;
  iVar3 = guess_exponent + -1;
  if (n < 0) {
    strings_internal::BigUnsigned<84>::FiveToTheNth(&local_2d8,-n);
    strings_internal::BigUnsigned<84>::MultiplyBy(&local_2d8,v);
    if (n < guess_exponent) {
      iVar3 = iVar3 - n;
      pBVar2 = &local_2d8;
    }
    else {
      iVar3 = n - iVar3;
      pBVar2 = &local_184;
    }
    strings_internal::BigUnsigned<84>::ShiftLeft(pBVar2,iVar3);
    iVar3 = strings_internal::Compare<84,84>(&local_184,&local_2d8);
  }
  else {
    strings_internal::BigUnsigned<84>::MultiplyByFiveToTheNth(&local_184,n);
    local_2d8.size_ = 2 - (uint)(guess_mantissa * 2 >> 0x20 == 0);
    memset(local_2d8.words_,0,0x150);
    local_2d8.words_[0] = (uint32_t)v;
    local_2d8.words_[1] = (uint32_t)(guess_mantissa * 2 >> 0x20);
    if (n < guess_exponent) {
      iVar3 = iVar3 - n;
      pBVar2 = &local_2d8;
    }
    else {
      iVar3 = n - iVar3;
      pBVar2 = &local_184;
    }
    strings_internal::BigUnsigned<84>::ShiftLeft(pBVar2,iVar3);
    iVar3 = strings_internal::Compare<84,84>(&local_184,&local_2d8);
  }
  if (iVar3 < 0) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if (iVar3 == 0) {
      bVar1 = (bool)((byte)guess_mantissa & 1);
    }
  }
  return bVar1;
}

Assistant:

bool MustRoundUp(uint64_t guess_mantissa, int guess_exponent,
                 const strings_internal::ParsedFloat& parsed_decimal) {
  // 768 is the number of digits needed in the worst case.  We could determine a
  // better limit dynamically based on the value of parsed_decimal.exponent.
  // This would optimize pathological input cases only.  (Sane inputs won't have
  // hundreds of digits of mantissa.)
  absl::strings_internal::BigUnsigned<84> exact_mantissa;
  int exact_exponent = exact_mantissa.ReadFloatMantissa(parsed_decimal, 768);

  // Adjust the `guess` arguments to be halfway between A and B.
  guess_mantissa = guess_mantissa * 2 + 1;
  guess_exponent -= 1;

  // In our comparison:
  // lhs = exact = exact_mantissa * 10**exact_exponent
  //             = exact_mantissa * 5**exact_exponent * 2**exact_exponent
  // rhs = guess = guess_mantissa * 2**guess_exponent
  //
  // Because we are doing integer math, we can't directly deal with negative
  // exponents.  We instead move these to the other side of the inequality.
  absl::strings_internal::BigUnsigned<84>& lhs = exact_mantissa;
  int comparison;
  if (exact_exponent >= 0) {
    lhs.MultiplyByFiveToTheNth(exact_exponent);
    absl::strings_internal::BigUnsigned<84> rhs(guess_mantissa);
    // There are powers of 2 on both sides of the inequality; reduce this to
    // a single bit-shift.
    if (exact_exponent > guess_exponent) {
      lhs.ShiftLeft(exact_exponent - guess_exponent);
    } else {
      rhs.ShiftLeft(guess_exponent - exact_exponent);
    }
    comparison = Compare(lhs, rhs);
  } else {
    // Move the power of 5 to the other side of the equation, giving us:
    // lhs = exact_mantissa * 2**exact_exponent
    // rhs = guess_mantissa * 5**(-exact_exponent) * 2**guess_exponent
    absl::strings_internal::BigUnsigned<84> rhs =
        absl::strings_internal::BigUnsigned<84>::FiveToTheNth(-exact_exponent);
    rhs.MultiplyBy(guess_mantissa);
    if (exact_exponent > guess_exponent) {
      lhs.ShiftLeft(exact_exponent - guess_exponent);
    } else {
      rhs.ShiftLeft(guess_exponent - exact_exponent);
    }
    comparison = Compare(lhs, rhs);
  }
  if (comparison < 0) {
    return false;
  } else if (comparison > 0) {
    return true;
  } else {
    // When lhs == rhs, the decimal input is exactly between A and B.
    // Round towards even -- round up only if the low bit of the initial
    // `guess_mantissa` was a 1.  We shifted guess_mantissa left 1 bit at
    // the beginning of this function, so test the 2nd bit here.
    return (guess_mantissa & 2) == 2;
  }
}